

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::get_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Decoration *pDVar4;
  Decoration *dec;
  Meta *local_30;
  Meta *m;
  uint32_t local_20;
  ExtendedDecorations decoration_local;
  uint32_t index_local;
  uint32_t type_local;
  Compiler *this_local;
  
  m._4_4_ = decoration;
  local_20 = index;
  decoration_local = type;
  _index_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&dec + 4),type);
  local_30 = ParsedIR::find_meta(&this->ir,dec._4_4_);
  if (local_30 == (Meta *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar2 = (ulong)local_20;
    sVar3 = VectorView<spirv_cross::Meta::Decoration>::size
                      (&(local_30->members).super_VectorView<spirv_cross::Meta::Decoration>);
    if (uVar2 < sVar3) {
      pDVar4 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                         (&(local_30->members).super_VectorView<spirv_cross::Meta::Decoration>,
                          (ulong)local_20);
      bVar1 = Bitset::get(&(pDVar4->extended).flags,m._4_4_);
      if (bVar1) {
        this_local._4_4_ = (pDVar4->extended).values[m._4_4_];
      }
      else {
        this_local._4_4_ = get_default_extended_decoration(m._4_4_);
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Compiler::get_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(type);
	if (!m)
		return 0;

	if (index >= m->members.size())
		return 0;

	auto &dec = m->members[index];
	if (!dec.extended.flags.get(decoration))
		return get_default_extended_decoration(decoration);
	return dec.extended.values[decoration];
}